

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O2

long __thiscall
booster::locale::impl_std::utf8_collator_from_wide::do_hash
          (utf8_collator_from_wide *this,char *b,char *e)

{
  collate *pcVar1;
  long lVar2;
  wstring tmp;
  allocator local_59;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"UTF-8",&local_59);
  conv::to_utf<wchar_t>(&local_58,b,e,&local_38,default_method);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = std::use_facet<std::__cxx11::collate<wchar_t>>(&this->base_);
  lVar2 = (**(code **)(*(long *)pcVar1 + 0x20))
                    (pcVar1,local_58._M_dataplus._M_p,
                     local_58._M_dataplus._M_p + local_58._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  return lVar2;
}

Assistant:

virtual long do_hash(char const *b,char const *e) const
    {
        std::wstring tmp=conv::to_utf<wchar_t>(b,e,"UTF-8");
        return std::use_facet<wfacet>(base_).hash(tmp.c_str(),tmp.c_str()+tmp.size());
    }